

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O1

void Nwk_ManGraphCheckLists(Nwk_Grf_t *p)

{
  uint uVar1;
  Nwk_Vrt_t *pNVar2;
  ulong uVar3;
  long lVar4;
  
  if (p->pLists1[0] != 0) {
    __assert_fail("p->pLists1[0] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkMerge.c"
                  ,0x196,"void Nwk_ManGraphCheckLists(Nwk_Grf_t *)");
  }
  uVar3 = 0;
  do {
    lVar4 = uVar3 + 1;
    uVar3 = uVar3 + 1;
    if ((long)p->pLists1[lVar4] != 0) {
      pNVar2 = p->pVerts[p->pLists1[lVar4]];
      if (pNVar2->nEdges != 1) {
        __assert_fail("pVertex->nEdges == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkMerge.c"
                      ,0x19b,"void Nwk_ManGraphCheckLists(Nwk_Grf_t *)");
      }
      uVar1 = p->pVerts[pNVar2[1].Id]->nEdges;
      if ((int)uVar1 < 0x11 && uVar3 != uVar1) {
        __assert_fail("pNext->nEdges == i || pNext->nEdges > NWK_MAX_LIST",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkMerge.c"
                      ,0x19d,"void Nwk_ManGraphCheckLists(Nwk_Grf_t *)");
      }
    }
  } while (uVar3 != 0x10);
  if (p->pLists2[0] != 0) {
    __assert_fail("p->pLists2[0] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkMerge.c"
                  ,0x1a0,"void Nwk_ManGraphCheckLists(Nwk_Grf_t *)");
  }
  if (p->pLists2[1] == 0) {
    lVar4 = 0;
    while (((long)p->pLists2[lVar4 + 2] == 0 ||
           (uVar1 = p->pVerts[p->pLists2[lVar4 + 2]]->nEdges,
           0x10 < (int)uVar1 || lVar4 + 2U == (ulong)uVar1))) {
      lVar4 = lVar4 + 1;
      if (lVar4 == 0xf) {
        return;
      }
    }
    __assert_fail("pVertex->nEdges == j || pVertex->nEdges > NWK_MAX_LIST",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkMerge.c"
                  ,0x1a6,"void Nwk_ManGraphCheckLists(Nwk_Grf_t *)");
  }
  __assert_fail("p->pLists2[1] == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkMerge.c"
                ,0x1a1,"void Nwk_ManGraphCheckLists(Nwk_Grf_t *)");
}

Assistant:

void Nwk_ManGraphCheckLists( Nwk_Grf_t * p )
{
    Nwk_Vrt_t * pVertex, * pNext;
    int i, j;
    assert( p->pLists1[0] == 0 );
    for ( i = 1; i <= NWK_MAX_LIST; i++ )
        if ( p->pLists1[i] )
        {
            pVertex = p->pVerts[ p->pLists1[i] ];
            assert( pVertex->nEdges == 1 );
            pNext = p->pVerts[ pVertex->pEdges[0] ];
            assert( pNext->nEdges == i || pNext->nEdges > NWK_MAX_LIST );
        }
    // find the next vertext to extract
    assert( p->pLists2[0] == 0 );
    assert( p->pLists2[1] == 0 );
    for ( j = 2; j <= NWK_MAX_LIST; j++ )
        if ( p->pLists2[j] )
        {
            pVertex = p->pVerts[ p->pLists2[j] ];
            assert( pVertex->nEdges == j || pVertex->nEdges > NWK_MAX_LIST );
        }
}